

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

bool __thiscall cmCTest::CTestFileExists(cmCTest *this,string *filename)

{
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var1;
  long lVar2;
  bool bVar3;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string testingDir;
  long *local_a8 [2];
  long local_98 [2];
  string local_88;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  _Var1._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  lVar2 = *(long *)&((_Var1._M_head_impl)->BinaryDir)._M_dataplus;
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a8,lVar2,
             *(size_type *)((long)&(_Var1._M_head_impl)->BinaryDir + 8) + lVar2);
  std::__cxx11::string::append((char *)local_a8);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_a8,
                              *(ulong *)&(((this->Impl)._M_t.
                                           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                           .super__Head_base<0UL,_cmCTest::Private_*,_false>.
                                          _M_head_impl)->CurrentTag)._M_dataplus);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_58 = *plVar5;
    lStack_50 = plVar4[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar5;
    local_68 = (long *)*plVar4;
  }
  local_60 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_68);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_38 = *plVar5;
    lStack_30 = plVar4[3];
    local_48 = &local_38;
  }
  else {
    local_38 = *plVar5;
    local_48 = (long *)*plVar4;
  }
  local_40 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_48,(ulong)(filename->_M_dataplus)._M_p);
  psVar6 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_88.field_2._M_allocated_capacity = *psVar6;
    local_88.field_2._8_8_ = plVar4[3];
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  }
  else {
    local_88.field_2._M_allocated_capacity = *psVar6;
    local_88._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_88._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_48 != &local_38) {
    operator_delete(local_48,local_38 + 1);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  bVar3 = cmsys::SystemTools::FileExists(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool cmCTest::CTestFileExists(const std::string& filename)
{
  std::string testingDir = this->Impl->BinaryDir + "/Testing/" +
    this->Impl->CurrentTag + "/" + filename;
  return cmSystemTools::FileExists(testingDir);
}